

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O1

ClassBuilder * __thiscall Lodtalk::ClassBuilder::setName(ClassBuilder *this,char *name)

{
  VMContext *context;
  undefined8 *puVar1;
  Oop value;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  allocator local_39;
  string local_38;
  
  context = this->context;
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)ByteSymbol::fromNative(context,&local_38);
  puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
  if (puVar1 != &NilObject) {
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar1 + 9) = aVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    value.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)(this->clazz).reference.oop.field_0.uintValue
    ;
    if (value.field_0 != (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
      VMContext::setGlobalVariable
                (this->context,
                 (Oop)*(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)value.field_0 + 0x48),value);
      return this;
    }
  }
  __assert_fail("!isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x3bf,"T *Lodtalk::Ref<Lodtalk::Class>::operator->() const [T = Lodtalk::Class]");
}

Assistant:

ClassBuilder &ClassBuilder::setName(const char *name)
{
    clazz->name = ByteSymbol::fromNative(context, name);
    context->setGlobalVariable(clazz->name, clazz.getOop());
    return *this;
}